

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<Symbol>::append(QList<Symbol> *this,QList<Symbol> *other)

{
  bool bVar1;
  Symbol *pSVar2;
  QArrayDataPointer<Symbol> *in_RSI;
  Symbol *in_RDI;
  QArrayDataPointer<Symbol> *unaff_retaddr;
  QArrayDataPointer<Symbol> *in_stack_ffffffffffffffe0;
  GrowthPosition where;
  
  pSVar2 = in_RDI;
  bVar1 = isEmpty((QList<Symbol> *)0x146926);
  where = (GrowthPosition)((ulong)pSVar2 >> 0x20);
  if (!bVar1) {
    QArrayDataPointer<Symbol>::operator->(in_RSI);
    bVar1 = QArrayDataPointer<Symbol>::needsDetach(in_stack_ffffffffffffffe0);
    if (bVar1) {
      append((QList<Symbol> *)in_RSI,(QList<Symbol> *)in_RDI);
    }
    else {
      size((QList<Symbol> *)in_RSI);
      QArrayDataPointer<Symbol>::detachAndGrow
                (unaff_retaddr,where,(qsizetype)in_RSI,(Symbol **)in_RDI,in_stack_ffffffffffffffe0);
      QArrayDataPointer<Symbol>::operator->((QArrayDataPointer<Symbol> *)in_RDI);
      QArrayDataPointer<Symbol>::operator->(in_RSI);
      pSVar2 = QArrayDataPointer<Symbol>::begin((QArrayDataPointer<Symbol> *)0x14699b);
      QArrayDataPointer<Symbol>::operator->(in_RSI);
      QArrayDataPointer<Symbol>::end((QArrayDataPointer<Symbol> *)pSVar2);
      QtPrivate::QGenericArrayOps<Symbol>::moveAppend
                ((QGenericArrayOps<Symbol> *)in_RSI,in_RDI,pSVar2);
    }
  }
  return;
}

Assistant:

inline void QList<T>::append(QList<T> &&other)
{
    Q_ASSERT(&other != this);
    if (other.isEmpty())
        return;
    if (other.d->needsDetach() || !std::is_nothrow_move_constructible_v<T>)
        return append(other);

    // due to precondition &other != this, we can unconditionally modify 'this'
    d.detachAndGrow(QArrayData::GrowsAtEnd, other.size(), nullptr, nullptr);
    Q_ASSERT(d.freeSpaceAtEnd() >= other.size());
    d->moveAppend(other.d->begin(), other.d->end());
}